

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

_Bool sx_fiber_stack_init(sx_fiber_stack *fstack,uint size)

{
  code *pcVar1;
  undefined1 uVar2;
  size_t sVar3;
  void *__addr;
  size_t __len;
  void *ptr;
  uint size_local;
  sx_fiber_stack *fstack_local;
  
  ptr._4_4_ = size;
  if (size == 0) {
    ptr._4_4_ = 0x20000;
  }
  sVar3 = sx_os_align_pagesz((ulong)ptr._4_4_);
  __addr = mmap((void *)0x0,sVar3 & 0xffffffff,3,0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0x36);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0x36,"Out of memory");
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (_Bool)uVar2;
  }
  __len = sx_os_pagesz();
  mprotect(__addr,__len,0);
  fstack->sptr = (void *)((long)__addr + (sVar3 & 0xffffffff));
  fstack->ssize = (uint)sVar3;
  return true;
}

Assistant:

bool sx_fiber_stack_init(sx_fiber_stack* fstack, unsigned int size)
{
    if (size == 0)
        size = DEFAULT_STACK_SIZE;
    size = (uint32_t)sx_os_align_pagesz(size);
    void* ptr;

#if SX_PLATFORM_WINDOWS
    ptr = VirtualAlloc(NULL, size, MEM_COMMIT | MEM_RESERVE, PAGE_READWRITE);
    if (!ptr) {
        sx_out_of_memory();
        return false;
    }
    DWORD old_opts;
    VirtualProtect(ptr, sx_os_pagesz(), PAGE_READWRITE | PAGE_GUARD, &old_opts);
#elif SX_PLATFORM_POSIX
    ptr = mmap(0, size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (ptr == MAP_FAILED) {
        sx_out_of_memory();
        return false;
    }
    mprotect(ptr, sx_os_pagesz(), PROT_NONE);
#else
    ptr = malloc(size);
    if (!ptr) {
        sx_out_of_memory();
        return false;
    }
#endif

    fstack->sptr = (uint8_t*)ptr + size;    // Move to end of the memory block for stack pointer
    fstack->ssize = size;
    return true;
}